

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ProcessHelper.cpp
# Opt level: O1

ai_real Assimp::ComputePositionEpsilon(aiMesh *pMesh)

{
  float fVar1;
  float fVar2;
  float fVar3;
  aiVector3D *paVar4;
  long lVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  if ((ulong)pMesh->mNumVertices == 0) {
    fVar6 = -2e+10;
    fVar7 = 1e+10;
    fVar10 = 1e+10;
    fVar8 = -1e+10;
    fVar9 = -1e+10;
  }
  else {
    paVar4 = pMesh->mVertices;
    fVar11 = 1e+10;
    fVar7 = 1e+10;
    fVar10 = 1e+10;
    fVar8 = -1e+10;
    fVar9 = -1e+10;
    fVar6 = -1e+10;
    lVar5 = 0;
    do {
      fVar1 = *(float *)((long)&paVar4->x + lVar5);
      fVar2 = *(float *)((long)&paVar4->y + lVar5);
      if (fVar1 <= fVar7) {
        fVar7 = fVar1;
      }
      if (fVar2 <= fVar10) {
        fVar10 = fVar2;
      }
      fVar3 = *(float *)((long)&paVar4->z + lVar5);
      if (fVar3 <= fVar11) {
        fVar11 = fVar3;
      }
      if (fVar8 <= fVar1) {
        fVar8 = fVar1;
      }
      if (fVar9 <= fVar2) {
        fVar9 = fVar2;
      }
      if (fVar6 <= fVar3) {
        fVar6 = fVar3;
      }
      lVar5 = lVar5 + 0xc;
    } while ((ulong)pMesh->mNumVertices * 0xc != lVar5);
    fVar6 = fVar6 - fVar11;
  }
  fVar7 = fVar6 * fVar6 + (fVar8 - fVar7) * (fVar8 - fVar7) + (fVar9 - fVar10) * (fVar9 - fVar10);
  if (fVar7 < 0.0) {
    fVar7 = sqrtf(fVar7);
  }
  else {
    fVar7 = SQRT(fVar7);
  }
  return fVar7 * 0.0001;
}

Assistant:

ai_real ComputePositionEpsilon(const aiMesh* pMesh)
{
    const ai_real epsilon = ai_real( 1e-4 );

    // calculate the position bounds so we have a reliable epsilon to check position differences against
    aiVector3D minVec, maxVec;
    ArrayBounds(pMesh->mVertices,pMesh->mNumVertices,minVec,maxVec);
    return (maxVec - minVec).Length() * epsilon;
}